

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId callApplyCallSiteId)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  FunctionBody *this_00;
  undefined4 *puVar4;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> **ppWVar5;
  FunctionCodeGenRuntimeData **ppFVar6;
  nullptr_t local_28;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_20;
  ProfileId local_12;
  FunctionCodeGenRuntimeData *pFStack_10;
  ProfileId callApplyCallSiteId_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_12 = callApplyCallSiteId;
  pFStack_10 = this;
  this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
  PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
  if (PVar3 <= callApplyCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xc5,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->callApplyTargetInlinees);
  if (*ppWVar5 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr(&local_20,&local_28);
  }
  else {
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->callApplyTargetInlinees);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
              (&local_20,*ppWVar5 + local_12);
  }
  ppFVar6 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                      ((WriteBarrierPtr *)&local_20);
  return *ppFVar6;
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(const ProfileId callApplyCallSiteId) const
    {
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());

        return callApplyTargetInlinees ? callApplyTargetInlinees[callApplyCallSiteId] : nullptr;
    }